

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

vm_obj_id_t CVmObjByteArray::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_val_t *this;
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t obj_id;
  int iVar2;
  CVmObjByteArray *pCVar3;
  char *str;
  uint uVar4;
  vm_val_t *pvVar5;
  vm_val_t *strval;
  unsigned_long ele_count;
  unsigned_long src_idx;
  
  pvVar5 = sp_;
  if (argc != 0) {
    if (sp_[-1].typ == VM_INT) {
      if (argc != 1) goto LAB_0026d885;
      iVar2 = sp_[-1].val.intval;
      obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
      pCVar3 = (CVmObjByteArray *)CVmObject::operator_new(0x10,obj_id);
      (pCVar3->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00360548;
      alloc_array(pCVar3,(long)iVar2);
      fill_with(pCVar3,'\0',1,(long)iVar2);
    }
    else {
      this = sp_ + -1;
      strval = this;
      str = vm_val_t::get_as_string(this);
      if (str == (char *)0x0) {
        if (this->typ == VM_OBJ) {
          uVar4 = pvVar5[-1].val.obj;
          iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4 >> 0xc][uVar4 & 0xfff].ptr_ + 8)
                  )();
          if (iVar2 != 0) {
            uVar4 = pvVar5[-1].val.obj;
            pCVar1 = G_obj_table_X.pages_[uVar4 >> 0xc];
            uVar4 = uVar4 & 0xfff;
            ele_count = (unsigned_long)**(uint **)((long)&pCVar1[uVar4].ptr_ + 8);
            src_idx = 1;
            if (argc != 1) {
              if (sp_[-2].typ != VM_INT) {
LAB_0026d899:
                err_throw(0x7d5);
              }
              src_idx = (unsigned_long)(int)(sp_[-2].val.obj + (uint)(sp_[-2].val.obj == 0));
              if (argc < 3) {
                if (ele_count < src_idx) {
                  ele_count = 0;
                }
                else {
                  ele_count = (ele_count - src_idx) + 1;
                }
              }
              else {
                if (sp_[-3].typ != VM_INT) goto LAB_0026d899;
                if (argc != 3) goto LAB_0026d885;
                ele_count = (unsigned_long)sp_[-3].val.intval;
              }
            }
            obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
            pCVar3 = (CVmObjByteArray *)CVmObject::operator_new(0x10,obj_id);
            (pCVar3->super_CVmObject)._vptr_CVmObject =
                 (_func_int **)&PTR_get_metaclass_reg_00360548;
            alloc_array(pCVar3,ele_count);
            copy_from(pCVar3,1,(CVmObjByteArray *)(pCVar1 + uVar4),src_idx,ele_count);
            goto LAB_0026d86a;
          }
        }
        err_throw(0x900);
      }
      if (2 < argc) goto LAB_0026d885;
      pvVar5 = (vm_val_t *)0x0;
      if (argc != 1) {
        pvVar5 = sp_ + -2;
      }
      obj_id = create_from_string(strval,str,pvVar5);
    }
LAB_0026d86a:
    sp_ = sp_ + -(ulong)argc;
    return obj_id;
  }
LAB_0026d885:
  err_throw(0x899);
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_stack(VMG_ const uchar **pc_ptr,
                                               uint argc)
{
    vm_obj_id_t id = VM_INVALID_OBJ;
    CVmObjByteArray *arr;
    unsigned long cnt;
    vm_val_t *arg1;
    const char *str;

    /* check our arguments */
    if (argc < 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* see what we have for the first argument */
    arg1 = G_stk->get(0);
    if (arg1->typ == VM_INT)
    {
        /* 
         *   it's a simple count argument - make sure we only have one
         *   argument 
         */
        if (argc != 1)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* get the number of elements */
        cnt = (unsigned long)arg1->val.intval;

        /* create the array with the given number of elements */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        arr = new (vmg_ id) CVmObjByteArray(vmg_ cnt);

        /* set each element to zero */
        arr->fill_with(0, 1, cnt);
    }
    else if ((str = arg1->get_as_string(vmg0_)) != 0)
    {
        /*
         *   String argument - we're creating a byte array from the string.
         *   We can map it from a character set, or we can just stuff the
         *   character values into bytes.  Check arguments - we must have one
         *   or two of them (the string, and the optional character set) 
         */
        if (argc < 1 || argc > 2)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* fetch the character mapper, if there is one */
        const vm_val_t *cmap = (argc >= 2 ? G_stk->get(1) : 0);

        /* create the byte array */
        id = create_from_string(vmg_ G_stk->get(0), str, cmap);
    }
    else if (arg1->typ == VM_OBJ && is_byte_array(vmg_ arg1->val.obj))
    {
        unsigned long src_idx;
        unsigned long src_cnt;

        /* remember the source array */
        CVmObjByteArray *src_arr =
            (CVmObjByteArray *)vm_objp(vmg_ arg1->val.obj);

        /* get the count from the array */
        src_cnt = src_arr->get_element_count();

        /* 
         *   check for the optional actual element count, and the optional
         *   starting index 
         */
        if (argc == 1)
        {
            /* no size specified - use the same size as the original */
            cnt = src_cnt;

            /* start at the first element */
            src_idx = 1;
        }
        else
        {
            /* make sure it's an integer */
            if (G_stk->get(1)->typ != VM_INT)
                err_throw(VMERR_INT_VAL_REQD);

            /* use the specified starting index */
            src_idx = (unsigned long)G_stk->get(1)->val.intval;

            /* if the index is below 1, force it to 1 */
            if (src_idx < 1)
                src_idx = 1;

            /* check for the starting element argument */
            if (argc >= 3)
            {
                /* make sure it's an integer */
                if (G_stk->get(2)->typ != VM_INT)
                    err_throw(VMERR_INT_VAL_REQD);

                /* use the specified element count */
                cnt = (unsigned long)G_stk->get(2)->val.intval;

                /* make sure we don't have any extra arguments */
                if (argc > 3)
                    err_throw(VMERR_WRONG_NUM_OF_ARGS);
            }
            else
            {
                /* 
                 *   no count specified - use the number of elements in the
                 *   original remaining after the starting index 
                 */
                if (src_idx > src_cnt)
                    cnt = 0;
                else
                    cnt = src_cnt + 1 - src_idx;
            }
        }

        /* create the new array */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        arr = new (vmg_ id) CVmObjByteArray(vmg_ cnt);

        /* copy the source array */
        arr->copy_from(1, src_arr, src_idx, cnt);
    }
    else
    {
        /* invalid argument */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new object */
    return id;
}